

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O2

void __thiscall
Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
          (PrototypeChainCache<Js::OnlyWritablePropertyCache> *this)

{
  int iVar1;
  Type *pTVar2;
  int i;
  int index;
  
  index = 0;
  while( true ) {
    iVar1 = (this->types).super_ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer>.count;
    if (iVar1 <= index) break;
    pTVar2 = JsUtil::
             List<Js::Type_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Item
                       (&this->types,index);
    OnlyWritablePropertyCache::ClearType(pTVar2->ptr);
    index = index + 1;
  }
  if (iVar1 != 0) {
    memset((this->types).super_ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer>.buffer.
           ptr,0,(long)iVar1 << 3);
    (this->types).super_ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer>.count = 0;
  }
  return;
}

Assistant:

void
PrototypeChainCache<T>::Clear()
{
    for (int i = 0; i < this->types.Count(); ++i)
    {
        T::ClearType(this->types.Item(i));
    }
    this->types.ClearAndZero();
}